

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-left-rotation.cpp
# Opt level: O1

int main(void)

{
  istream *this;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  int length;
  int shift;
  vector<int,_std::allocator<int>_> xs;
  allocator_type local_39;
  int local_38;
  int local_34;
  vector<int,_std::allocator<int>_> local_30;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_38);
  std::istream::operator>>(this,&local_34);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,(long)local_38,&local_39);
  if (0 < local_38) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      std::istream::operator>>
                ((istream *)&std::cin,
                 (int *)((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar3 < local_38);
  }
  rotate(&local_30,local_34 % local_38);
  if (0 < local_38) {
    lVar2 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar2]);
      local_39 = (allocator_type)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_39,1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_38);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  int length, shift;
  std::cin >> length >> shift;
  std::vector<int> xs(length);
  for (int i = 0; i < length; ++i) {
    std::cin >> xs[i];
  }
  rotate(xs, shift % length);
  for (int i = 0; i < length; ++i) {
    std::cout << xs[i] << ' ';
  }
  std::cout << std::endl;
  return 0;
}